

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::goToUrl(QFileDialogPrivate *this,QUrl *url)

{
  QFileSystemModelPrivate *pQVar1;
  QModelIndex *in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileSystemNode *node;
  QModelIndex idx;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QFileSystemModel::d_func((QFileSystemModel *)0x754866);
  QUrl::toLocalFile();
  QFileSystemModelPrivate::node((QString *)pQVar1,SUB81(local_20,0));
  QString::~QString((QString *)0x7548a0);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = QFileSystemModel::d_func((QFileSystemModel *)0x7548d6);
  QFileSystemModelPrivate::index((QFileSystemNode *)&local_38,(int)pQVar1);
  enterDirectory(in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::goToUrl(const QUrl &url)
{
    //The shortcut in the side bar may have a parent that is not fetched yet (e.g. an hidden file)
    //so we force the fetching
    QFileSystemModelPrivate::QFileSystemNode *node = model->d_func()->node(url.toLocalFile(), true);
    QModelIndex idx =  model->d_func()->index(node);
    enterDirectory(idx);
}